

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

void quat_get_axes(quat q,vec3 *x,vec3 *y,vec3 *z)

{
  undefined1 local_70 [8];
  mat4 m;
  vec3 *z_local;
  vec3 *y_local;
  vec3 *x_local;
  quat q_local;
  
  m.m._56_8_ = z;
  mat4_from_quat((mat4 *)local_70,q);
  x->x = (float)local_70._0_4_;
  y->x = (float)local_70._4_4_;
  *(float *)m.m._56_8_ = m.m[0];
  x->y = m.m[2];
  y->y = m.m[3];
  *(float *)(m.m._56_8_ + 4) = m.m[4];
  x->z = m.m[6];
  y->z = m.m[7];
  *(float *)(m.m._56_8_ + 8) = m.m[8];
  return;
}

Assistant:

void quat_get_axes(quat q, vec3 *x, vec3 *y, vec3 *z) {
    mat4 m = mat4_from_quat(q);

    x->x = m.m[0];
    y->x = m.m[1];
    z->x = m.m[2];

    x->y = m.m[4];
    y->y = m.m[5];
    z->y = m.m[6];

    x->z = m.m[8];
    y->z = m.m[9];
    z->z = m.m[10];
}